

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O1

bool axl::cry::verifyAppStoreReceipt(AppStoreReceipt *receipt,void *p,size_t size,uint_t flags)

{
  bool bVar1;
  Array<char,_axl::sl::ArrayDetails<char>_> computerGuid;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_28;
  
  local_28.m_p = (char *)0x0;
  local_28.m_hdr = (Hdr *)0x0;
  local_28.m_count = 0;
  bVar1 = verifyAppStoreReceipt(receipt,p,size,(void *)0x0,0,flags);
  sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_28);
  return bVar1;
}

Assistant:

bool
verifyAppStoreReceipt(
	AppStoreReceipt* receipt,
	const void* p,
	size_t size,
	uint_t flags
) {
	sl::Array<char> computerGuid;

#if (_AXL_OS_DARWIN)
	if (!(flags & VerifyAppStoreReceiptFlag_SkipSignatureCheck)) {
		size_t result = iok::getComputerGuid(&computerGuid);
		if (result == -1)
			return false;
	}
#endif

	return verifyAppStoreReceipt(receipt, p, size, computerGuid, computerGuid.getCount(), flags);
}